

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderDepthbuffer::invokeGLES2
          (RenderDepthbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  pointer *this_00;
  ChannelOrder CVar1;
  TestLog *log;
  Functions *gl;
  ConstPixelBufferAccess *this_01;
  glReadPixelsFunc p_Var2;
  bool bVar3;
  GLenum GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLint GVar7;
  TestError *pTVar8;
  undefined8 *puVar9;
  int y;
  int y_00;
  Vector<float,_4> *v;
  int x;
  int x_00;
  int iVar10;
  long lVar11;
  float fVar12;
  RGBA compareThreshold;
  Surface referenceScreen;
  Surface screen;
  Renderbuffer renderbufferDepth;
  Renderbuffer renderbufferColor;
  Vec4 color;
  void *local_290;
  Vec4 local_288;
  Framebuffer framebuffer;
  Vector<float,_4> local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 *local_1c8;
  undefined8 uStack_1c0;
  Program program;
  
  log = (api->super_CallLogWrapper).m_log;
  gl = api->m_gl;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&framebuffer,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&renderbufferColor,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&renderbufferDepth,gl);
  compareThreshold.m_value = 0x20202020;
  CVar1 = (reference->super_TextureLevelPyramid).m_format.order;
  if ((CVar1 != D) && (CVar1 != DS)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_01e089b8;
    __cxa_throw(puVar9,&IllegalRendererException::typeinfo,std::exception::~exception);
  }
  this_00 = &program.super_ShaderProgram.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  program.super_ShaderProgram.m_shaders[0].
  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Rendering with depth buffer");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d4);
  (*gl->bindRenderbuffer)(0x8d41,renderbufferColor.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d6);
  (*gl->renderbufferStorage)(0x8d41,0x8056,reference->m_width,reference->m_height);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,
                  "renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1d7);
  framebufferRenderbuffer(gl,0x8ce0,renderbufferColor.super_ObjectWrapper.m_object);
  (*gl->bindRenderbuffer)(0x8d41,renderbufferDepth.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1da);
  imageTargetRenderbuffer
            ((api->super_ImageApi).m_egl,gl,
             ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
              m_data.ptr)->m_image);
  framebufferRenderbuffer(gl,0x8d00,renderbufferDepth.super_ObjectWrapper.m_object);
  (*gl->bindRenderbuffer)(0x8d41,0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1dd);
  (*gl->viewport)(0,0,reference->m_width,reference->m_height);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x1df);
  anon_unknown_1::Program::Program
            (&program,gl,
             "attribute highp vec2 a_coord;\nuniform highp float u_depth;\nvoid main(void) {\n\tgl_Position = vec4(a_coord, u_depth, 1.0);\n}\n"
             ,"uniform mediump vec4 u_color;\nvoid main(void) {\n\tgl_FragColor = u_color;\n}");
  if (program.super_ShaderProgram.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
               ,0x1f0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->useProgram)(program.super_ShaderProgram.m_program.m_program);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"useProgram(glProgram)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,499);
  GVar5 = (*gl->getAttribLocation)(program.super_ShaderProgram.m_program.m_program,"a_coord");
  if (GVar5 != 0xffffffff) {
    GVar6 = (*gl->getUniformLocation)(program.super_ShaderProgram.m_program.m_program,"u_color");
    if (GVar6 == -1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Couldn\'t find uniform u_color","(int)colorLoc != (int)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                 ,0x1f9);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar7 = (*gl->getUniformLocation)(program.super_ShaderProgram.m_program.m_program,"u_depth");
    if (GVar7 != -1) {
      (*gl->clearColor)(0.5,1.0,0.5,1.0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"clearColor(0.5f, 1.0f, 0.5f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x1fe);
      (*gl->clear)(0x4000);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x1ff);
      local_258.m_data[0] = 1.0;
      local_258.m_data[1] = 0.0;
      local_258.m_data[2] = 0.0;
      local_258.m_data[3] = 1.0;
      local_248 = 0x3f80000000000000;
      uStack_240 = 0x3f80000000000000;
      local_238 = 0x3f8000003f800000;
      uStack_230 = 0x3f80000000000000;
      local_228 = 0;
      uStack_220 = 0x3f8000003f800000;
      local_218 = 0x3f800000;
      uStack_210 = 0x3f8000003f800000;
      local_208 = 0x3f8000003f800000;
      uStack_200 = 0x3f80000000000000;
      local_1f8 = 0x3f8000003f800000;
      uStack_1f0 = 0x3f8000003f800000;
      local_1e8 = 0x3f000000;
      uStack_1e0 = 0x3f80000000000000;
      local_1d8 = 0x3f00000000000000;
      uStack_1d0 = 0x3f80000000000000;
      local_1c8 = &DAT_3f0000003f000000;
      uStack_1c0 = 0x3f80000000000000;
      (*gl->enableVertexAttribArray)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"enableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x20f);
      (*gl->vertexAttribPointer)(GVar5,2,0x1406,'\0',0,squareTriangleCoords);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,
                      "vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x210);
      (*gl->enable)(0xb71);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"enable(GL_DEPTH_TEST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x212);
      (*gl->depthFunc)(0x201);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthFunc(GL_LESS)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x213);
      (*gl->depthMask)('\0');
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthMask(GL_FALSE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x214);
      v = &local_258;
      for (lVar11 = -10; lVar11 != 0; lVar11 = lVar11 + 1) {
        tcu::Vector<float,_4>::Vector(&color,v);
        fVar12 = (float)((int)lVar11 + 0xb) * 0.1;
        (*gl->uniform4f)(GVar6,color.m_data[0],color.m_data[1],color.m_data[2],color.m_data[3]);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21b);
        (*gl->uniform1f)(GVar7,fVar12 + fVar12 + -1.0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"uniform1f(depthLoc, clipDepth)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21c);
        (*gl->drawArrays)(4,0,6);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"drawArrays(GL_TRIANGLES, 0, 6)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x21d);
        v = v + 1;
      }
      (*gl->depthMask)('\x01');
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"depthMask(GL_TRUE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x220);
      (*gl->disable)(0xb71);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"disable(GL_DEPTH_TEST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x221);
      (*gl->disableVertexAttribArray)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"disableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x222);
      this_01 = &((reference->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
      tcu::Surface::Surface(&screen,reference->m_width,reference->m_height);
      tcu::Surface::Surface(&referenceScreen,reference->m_width,reference->m_height);
      p_Var2 = gl->readPixels;
      tcu::Surface::getAccess((PixelBufferAccess *)&color,&screen);
      (*p_Var2)(0,0,screen.m_width,screen.m_height,0x1908,0x1401,local_290);
      for (y_00 = 0; y_00 < reference->m_height; y_00 = y_00 + 1) {
        for (x_00 = 0; x_00 < reference->m_width; x_00 = x_00 + 1) {
          local_288.m_data[0] = 0.5;
          local_288.m_data[1] = 1.0;
          local_288.m_data[2] = 0.5;
          local_288.m_data[3] = 1.0;
          iVar10 = 1;
          for (lVar11 = 0; lVar11 != 0xa0; lVar11 = lVar11 + 0x10) {
            fVar12 = tcu::ConstPixelBufferAccess::getPixDepth(this_01,x_00,y_00,0);
            if ((float)iVar10 * 0.1 < fVar12) {
              local_288.m_data._0_8_ = *(undefined8 *)((long)local_258.m_data + lVar11);
              local_288.m_data._8_8_ = *(undefined8 *)((long)local_258.m_data + lVar11 + 8);
            }
            iVar10 = iVar10 + 1;
          }
          tcu::Surface::getAccess((PixelBufferAccess *)&color,&referenceScreen);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&color,&local_288,x_00,y_00,0);
        }
      }
      (*gl->bindFramebuffer)(0x8d40,0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x23a);
      (*gl->finish)();
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"finish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x23b);
      bVar3 = tcu::pixelThresholdCompare
                        (log,"Depth buffer rendering result",
                         "Result from rendering with depth buffer",&referenceScreen,&screen,
                         &compareThreshold,COMPARE_LOG_RESULT);
      tcu::Surface::~Surface(&referenceScreen);
      tcu::Surface::~Surface(&screen);
      glu::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
      glu::ObjectWrapper::~ObjectWrapper(&renderbufferDepth.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&renderbufferColor.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
      return bVar3;
    }
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Couldn\'t find uniform u_depth","(int)depthLoc != (int)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
               ,0x1fc);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Couldn\'t find attribute a_coord","(int)coordLoc != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x1f6);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool GLES2ImageApi::RenderDepthbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl					= api.m_gl;
	tcu::TestLog&			log					= api.getLog();
	Framebuffer				framebuffer			(gl);
	Renderbuffer			renderbufferColor	(gl);
	Renderbuffer			renderbufferDepth	(gl);
	const tcu::RGBA			compareThreshold	(32, 32, 32, 32); // layer colors are far apart, large thresholds are ok

	// Branch only taken in TryAll case
	if (reference.getFormat().order != tcu::TextureFormat::DS && reference.getFormat().order != tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, interpreting non-depth data as depth data is not meaningful

	log << tcu::TestLog::Message << "Rendering with depth buffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor));
	GLU_CHECK_GLW_CALL(gl, renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight()));
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbufferColor);

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_DEPTH_ATTACHMENT, *renderbufferDepth);
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	// Render
	const char* vertexShader =
		"attribute highp vec2 a_coord;\n"
		"uniform highp float u_depth;\n"
		"void main(void) {\n"
		"\tgl_Position = vec4(a_coord, u_depth, 1.0);\n"
		"}\n";

	const char* fragmentShader =
		"uniform mediump vec4 u_color;\n"
		"void main(void) {\n"
		"\tgl_FragColor = u_color;\n"
		"}";

	Program program(gl, vertexShader, fragmentShader);
	TCU_CHECK(program.isOk());

	GLuint glProgram = program.getProgram();
	GLU_CHECK_GLW_CALL(gl, useProgram(glProgram));

	GLuint coordLoc = gl.getAttribLocation(glProgram, "a_coord");
	TCU_CHECK_MSG((int)coordLoc != -1, "Couldn't find attribute a_coord");

	GLuint colorLoc = gl.getUniformLocation(glProgram, "u_color");
	TCU_CHECK_MSG((int)colorLoc != (int)-1, "Couldn't find uniform u_color");

	GLuint depthLoc = gl.getUniformLocation(glProgram, "u_depth");
	TCU_CHECK_MSG((int)depthLoc != (int)-1, "Couldn't find uniform u_depth");

	GLU_CHECK_GLW_CALL(gl, clearColor(0.5f, 1.0f, 0.5f, 1.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

	tcu::Vec4 depthLevelColors[] = {
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),

		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f)
	};

	GLU_CHECK_GLW_CALL(gl, enableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords));

	GLU_CHECK_GLW_CALL(gl, enable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, depthFunc(GL_LESS));
	GLU_CHECK_GLW_CALL(gl, depthMask(GL_FALSE));

	for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
	{
		const tcu::Vec4	color		= depthLevelColors[level];
		const float		clipDepth	= ((float)(level + 1) * 0.1f) * 2.0f - 1.0f; // depth in clip coords

		GLU_CHECK_GLW_CALL(gl, uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w()));
		GLU_CHECK_GLW_CALL(gl, uniform1f(depthLoc, clipDepth));
		GLU_CHECK_GLW_CALL(gl, drawArrays(GL_TRIANGLES, 0, 6));
	}

	GLU_CHECK_GLW_CALL(gl, depthMask(GL_TRUE));
	GLU_CHECK_GLW_CALL(gl, disable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, disableVertexAttribArray(coordLoc));

	const ConstPixelBufferAccess&	refAccess		= reference.getLevel(0);
	tcu::Surface					screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface					referenceScreen	(reference.getWidth(), reference.getHeight());

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	for (int y = 0; y < reference.getHeight(); y++)
	{
		for (int x = 0; x < reference.getWidth(); x++)
		{
			tcu::Vec4 result = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);

			for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
			{
				if ((float)(level + 1) * 0.1f < refAccess.getPixDepth(x, y))
					result = depthLevelColors[level];
			}

			referenceScreen.getAccess().setPixel(result, x, y);
		}
	}

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	return tcu::pixelThresholdCompare(log, "Depth buffer rendering result", "Result from rendering with depth buffer", referenceScreen, screen, compareThreshold, tcu::COMPARE_LOG_RESULT);
}